

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O2

void BrotliCompressFragmentTwoPassImpl16
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint8_t *puVar7;
  ulong *puVar8;
  byte bVar9;
  uint uVar10;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  long *plVar11;
  long *plVar12;
  long lVar13;
  int *piVar14;
  size_t input_size_00;
  ulong *puVar15;
  long *input_00;
  long *__src;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  bool bVar24;
  long lStackY_a0;
  uint32_t *local_90;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  while( true ) {
    if (input_size == 0) {
      return;
    }
    input_size_00 = 0x20000;
    if (input_size < 0x20000) {
      input_size_00 = input_size;
    }
    plVar1 = (long *)((long)input_00 + input_size_00);
    puVar17 = commands;
    __src = input_00;
    local_90 = command_buf;
    if (0xf < input_size) break;
LAB_01f70b4a:
    if (__src < plVar1) {
      uVar10 = (uint)((long)plVar1 - (long)__src);
      if (5 < uVar10) {
        if (uVar10 < 0x82) {
          uVar10 = uVar10 - 2;
          uVar3 = 0x1f;
          if (uVar10 != 0) {
            for (; uVar10 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          bVar9 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
          uVar4 = uVar10 >> (bVar9 & 0x1f);
          uVar10 = (uVar10 - (uVar4 << (bVar9 & 0x1f))) * 0x100 |
                   uVar4 + (uVar3 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar10 < 0x842) {
          uVar3 = 0x1f;
          if (uVar10 - 0x42 != 0) {
            for (; uVar10 - 0x42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar10 = (((-1 << ((byte)uVar3 & 0x1f)) + uVar10 + -0x42) * 0x100 - (uVar3 ^ 0x1f)) + 0x29
          ;
        }
        else if (uVar10 < 0x1842) {
          uVar10 = uVar10 * 0x100 - 0x841eb;
        }
        else if (uVar10 < 0x5842) {
          uVar10 = uVar10 * 0x100 - 0x1841ea;
        }
        else {
          uVar10 = uVar10 * 0x100 - 0x5841e9;
        }
      }
      *puVar17 = uVar10;
      puVar17 = puVar17 + 1;
      uVar22 = (long)plVar1 - (long)__src & 0xffffffff;
      switchD_016b45db::default(local_90,__src,uVar22);
      local_90 = (uint32_t *)((long)local_90 + uVar22);
    }
    iVar6 = ShouldCompress(s,(uint8_t *)input_00,input_size_00,(long)local_90 - (long)command_buf);
    if (iVar6 == 0) {
      EmitUncompressedMetaBlock
                ((uint8_t *)input_00,input_size_00,(size_t *)table,(uint8_t *)storage_ix);
    }
    else {
      BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
      uVar22 = *(ulong *)table;
      uVar21 = uVar22 >> 3;
      *(ulong *)((long)storage_ix + uVar21) = (ulong)*(byte *)((long)storage_ix + uVar21);
      *(ulong *)table = uVar22 + 0xd;
      StoreCommands(s,(uint8_t *)command_buf,(long)local_90 - (long)command_buf,commands,
                    (long)puVar17 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
    }
    input_size = input_size - input_size_00;
    input_00 = plVar1;
  }
  uVar22 = input_size - 0x10;
  if (input_size_00 - 6 < input_size - 0x10) {
    uVar22 = input_size_00 - 6;
  }
  uVar21 = 0xffffffffffffffff;
LAB_01f70650:
  lVar13 = *(long *)((long)__src + 1);
  iVar6 = (int)uVar21;
  uVar16 = 0x20;
  plVar11 = (long *)((long)__src + 1);
  do {
    plVar12 = (long *)((uVar16 >> 5) + (long)plVar11);
    if ((long *)(uVar22 + (long)input_00) < plVar12) goto LAB_01f70b4a;
    uVar19 = (ulong)(lVar13 * 0x1e35a7bd0000) >> 0x30;
    lVar13 = *plVar12;
    iVar23 = (int)input;
    iVar5 = (int)plVar11;
    if (((((int)*plVar11 == *(int *)((long)plVar11 + -(long)iVar6)) &&
         (puVar7 = (uint8_t *)(-(long)iVar6 + (long)plVar11),
         *(uint8_t *)((long)plVar11 + 4) == puVar7[4])) &&
        (*(uint8_t *)((long)plVar11 + 5) == puVar7[5])) && (0 < iVar6)) {
      *(int *)(literal_buf + uVar19 * 4) = iVar5 - iVar23;
LAB_01f706ba:
      uVar19 = (long)plVar11 - (long)puVar7;
      if ((long)uVar19 < 0x3fff1) break;
    }
    else {
      iVar2 = *(int *)(literal_buf + uVar19 * 4);
      *(int *)(literal_buf + uVar19 * 4) = iVar5 - iVar23;
      if ((((int)*plVar11 == *(int *)(input + iVar2)) &&
          (puVar7 = input + iVar2, *(uint8_t *)((long)plVar11 + 4) == puVar7[4])) &&
         (*(uint8_t *)((long)plVar11 + 5) == puVar7[5])) goto LAB_01f706ba;
    }
    uVar16 = (ulong)((int)uVar16 + 1);
    plVar11 = plVar12;
  } while( true );
  puVar8 = (ulong *)(puVar7 + 6);
  puVar15 = (ulong *)((long)plVar11 + 6);
  uVar16 = (long)plVar1 + (-6 - (long)plVar11);
  lVar13 = 0;
LAB_01f70715:
  if (uVar16 < 8) {
    for (uVar20 = 0;
        (uVar16 != uVar20 && (*(char *)((long)puVar8 + uVar20) == *(char *)((long)puVar15 + uVar20))
        ); uVar20 = uVar20 + 1) {
    }
  }
  else {
    if (*puVar15 == *puVar8) goto code_r0x01f70726;
    uVar20 = *puVar8 ^ *puVar15;
    uVar16 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    uVar20 = uVar16 >> 3 & 0x1fffffff;
  }
  lVar13 = uVar20 - lVar13;
  uVar3 = iVar5 - (int)__src;
  uVar10 = uVar3;
  if (5 < uVar3) {
    if (uVar3 < 0x82) {
      uVar4 = uVar3 - 2;
      uVar10 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      bVar9 = (char)(uVar10 ^ 0xffffffe0) + 0x1f;
      uVar18 = uVar4 >> (bVar9 & 0x1f);
      uVar10 = (uVar4 - (uVar18 << (bVar9 & 0x1f))) * 0x100 |
               uVar18 + (uVar10 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar3 < 0x842) {
      uVar10 = 0x1f;
      if (uVar3 - 0x42 != 0) {
        for (; uVar3 - 0x42 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = (((-1 << ((byte)uVar10 & 0x1f)) + uVar3 + -0x42) * 0x100 - (uVar10 ^ 0x1f)) + 0x29;
    }
    else {
      iVar5 = uVar3 * 0x100;
      if (uVar3 < 0x1842) {
        uVar10 = iVar5 - 0x841eb;
      }
      else if (uVar3 < 0x5842) {
        uVar10 = iVar5 - 0x1841ea;
      }
      else {
        uVar10 = iVar5 - 0x5841e9;
      }
    }
  }
  *puVar17 = uVar10;
  switchD_016b45db::default(local_90,__src,(long)(int)uVar3);
  uVar10 = 0x40;
  uVar16 = uVar21;
  if (iVar6 != (int)uVar19) {
    uVar4 = (int)uVar19 + 3;
    uVar10 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    bVar9 = 0x1e - (char)(uVar10 ^ 0x1f);
    bVar24 = (uVar4 >> (bVar9 & 0x1f) & 1) != 0;
    uVar10 = (uint)bVar24 +
             ((uVar4 - (bVar24 + 2 << (bVar9 & 0x1f))) * 0x100 | (uVar10 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    uVar16 = uVar19;
  }
  uVar21 = lVar13 + 6;
  puVar17[1] = uVar10;
  if (uVar21 < 0xc) {
    uVar10 = (int)uVar21 + 0x14;
  }
  else {
    if (0x47 < uVar21) {
      if (uVar21 < 0x88) {
        uVar10 = ((uint)(lVar13 - 2U) & 0x1f) << 8 | (int)(lVar13 - 2U >> 5) + 0x36U;
LAB_01f708e7:
        puVar17[2] = uVar10;
      }
      else {
        if (0x847 < uVar21) {
          uVar10 = (int)uVar21 * 0x100 - 0x847c1;
          goto LAB_01f708e7;
        }
        uVar10 = (int)lVar13 - 0x42;
        iVar6 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        puVar17[2] = ((int)(-1L << ((byte)iVar6 & 0x3f)) + (int)lVar13 + -0x42) * 0x100 + iVar6 +
                     0x34;
      }
      puVar17[3] = 0x40;
      lStackY_a0 = 0x10;
      goto LAB_01f708f8;
    }
    uVar10 = 0x1f;
    uVar4 = (uint)(lVar13 - 2U);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    bVar9 = (char)(uVar10 ^ 0xffffffe0) + 0x1f;
    iVar6 = (int)(lVar13 - 2U >> (bVar9 & 0x3f));
    uVar10 = (uVar4 - (iVar6 << (bVar9 & 0x1f))) * 0x100 | iVar6 + (uVar10 ^ 0xffffffe0) * 2 + 0x5a;
  }
  puVar17[2] = uVar10;
  lStackY_a0 = 0xc;
LAB_01f708f8:
  __src = (long *)((long)plVar11 + lVar13 + 6);
  local_90 = (uint32_t *)((long)local_90 + (long)(int)uVar3);
  puVar17 = (uint *)((long)puVar17 + lStackY_a0);
  while( true ) {
    if ((long *)(uVar22 + (long)input_00) <= __src) goto LAB_01f70b4a;
    uVar21 = uVar16 & 0xffffffff;
    uVar16 = *(ulong *)((long)__src + -5);
    iVar5 = (int)__src - iVar23;
    *(int *)(literal_buf + (uVar16 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar5 + -5;
    *(int *)(literal_buf + ((uVar16 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar5 + -4;
    *(int *)(literal_buf + ((uVar16 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30) * 4) = iVar5 + -3;
    uVar16 = *(ulong *)((long)__src + -2);
    uVar19 = (uVar16 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30;
    *(int *)(literal_buf + (uVar16 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar5 + -2;
    *(int *)(literal_buf + ((uVar16 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar5 + -1;
    iVar6 = *(int *)(literal_buf + uVar19 * 4);
    *(int *)(literal_buf + uVar19 * 4) = iVar5;
    piVar14 = (int *)(input + iVar6);
    uVar16 = (long)__src - (long)piVar14;
    if ((((0x3fff0 < (long)uVar16) || ((int)*__src != *piVar14)) ||
        (*(char *)((long)__src + 4) != (char)piVar14[1])) ||
       (*(char *)((long)__src + 5) != *(char *)((long)piVar14 + 5))) break;
    puVar8 = (ulong *)((long)piVar14 + 6);
    puVar15 = (ulong *)((long)__src + 6);
    uVar21 = (long)plVar1 + (-6 - (long)__src);
    lVar13 = 0;
LAB_01f70a0e:
    if (uVar21 < 8) {
      for (uVar19 = 0;
          (uVar21 != uVar19 &&
          (*(char *)((long)puVar8 + uVar19) == *(char *)((long)puVar15 + uVar19)));
          uVar19 = uVar19 + 1) {
      }
    }
    else {
      if (*puVar15 == *puVar8) goto code_r0x01f70a1f;
      uVar19 = *puVar8 ^ *puVar15;
      uVar21 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar19 = uVar21 >> 3 & 0x1fffffff;
    }
    uVar19 = uVar19 - lVar13;
    uVar21 = uVar19 + 6;
    if (uVar21 < 10) {
      uVar10 = (int)uVar21 + 0x26;
    }
    else {
      uVar10 = (uint)uVar19;
      if (uVar21 < 0x86) {
        uVar3 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        bVar9 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
        iVar6 = (int)(uVar19 >> (bVar9 & 0x3f));
        uVar10 = (uVar10 - (iVar6 << (bVar9 & 0x1f))) * 0x100 |
                 iVar6 + (uVar3 ^ 0xffffffe0) * 2 + 0x6a;
      }
      else if (uVar21 < 0x846) {
        iVar6 = 0x1f;
        if (uVar10 - 0x40 != 0) {
          for (; uVar10 - 0x40 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar10 = ((int)(-1L << ((byte)iVar6 & 0x3f)) + uVar10 + -0x40) * 0x100 + iVar6 + 0x34;
      }
      else {
        uVar10 = (int)uVar21 * 0x100 - 0x845c1;
      }
    }
    uVar4 = (int)uVar16 + 3;
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar9 = 0x1e - (char)(uVar3 ^ 0x1f);
    bVar24 = (uVar4 >> (bVar9 & 0x1f) & 1) != 0;
    __src = (long *)((long)__src + uVar19 + 6);
    *puVar17 = uVar10;
    puVar17[1] = (uint)bVar24 +
                 ((uVar4 - (bVar24 + 2 << (bVar9 & 0x1f))) * 0x100 | (uVar3 ^ 0x1f) * 2 ^ 0x3e) +
                 0x4c;
    puVar17 = puVar17 + 2;
  }
  goto LAB_01f70650;
code_r0x01f70726:
  puVar15 = puVar15 + 1;
  puVar8 = puVar8 + 1;
  uVar16 = uVar16 - 8;
  lVar13 = lVar13 + -8;
  goto LAB_01f70715;
code_r0x01f70a1f:
  puVar15 = puVar15 + 1;
  puVar8 = puVar8 + 1;
  uVar21 = uVar21 - 8;
  lVar13 = lVar13 + -8;
  goto LAB_01f70a0e;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}